

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageChainMessageNode_analyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t chainedMessage,_Bool hasReceiver,
          sysbvm_tuple_t *receiver,sysbvm_tuple_t *environment)

{
  _Bool _Var1;
  size_t slotCount;
  size_t local_1a8;
  size_t i_1;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t i;
  size_t applicationArgumentCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_80_10_b9cdd4ba gcFrame;
  sysbvm_tuple_t *environment_local;
  sysbvm_tuple_t *receiver_local;
  _Bool hasReceiver_local;
  sysbvm_tuple_t chainedMessage_local;
  sysbvm_context_t *context_local;
  
  gcFrame.argument = (sysbvm_tuple_t)environment;
  memset(&gcFrameRecord.roots,0,0x50);
  gcFrameRecord.roots = (sysbvm_tuple_t *)chainedMessage;
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type =
       SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP|
       SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  applicationArgumentCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  gcFrame.node = (sysbvm_astMessageChainMessageNode_t *)
                 sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                           (context,gcFrameRecord.roots[5],*(sysbvm_tuple_t *)gcFrame.argument);
  slotCount = sysbvm_array_getSize(gcFrameRecord.roots[6]);
  if (hasReceiver) {
    gcFrame.selector = sysbvm_tuple_getType(context,*receiver);
    gcFrame.methodBinding =
         sysbvm_type_lookupSelector(context,gcFrame.selector,(sysbvm_tuple_t)gcFrame.node);
    if (gcFrame.methodBinding == 0) {
      gcFrame.methodBinding =
           sysbvm_type_lookupSelector
                     (context,gcFrame.selector,(context->roots).doesNotUnderstandSelector);
      if (gcFrame.methodBinding == 0) {
        sysbvm_error("Message not understood.");
      }
      gcFrame.message = sysbvm_array_create(context,slotCount);
      for (callFrameStack.gcRoots.applicationArguments[0xf] = 0;
          callFrameStack.gcRoots.applicationArguments[0xf] < slotCount;
          callFrameStack.gcRoots.applicationArguments[0xf] =
               callFrameStack.gcRoots.applicationArguments[0xf] + 1) {
        gcFrame.arguments =
             sysbvm_array_at(gcFrameRecord.roots[6],callFrameStack.gcRoots.applicationArguments[0xf]
                            );
        gcFrame.argumentNode =
             sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                       (context,gcFrame.arguments,*(sysbvm_tuple_t *)gcFrame.argument);
        sysbvm_array_atPut(gcFrame.argumentNode,callFrameStack.gcRoots.applicationArguments[0xf],
                           gcFrame.argumentNode);
      }
      gcFrame.result =
           sysbvm_message_create
                     (context,(sysbvm_tuple_t)gcFrame.node,gcFrame.message,gcFrame.selector,
                      gcFrameRecord.roots[2]);
      gcFrame.method =
           sysbvm_function_apply2(context,gcFrame.methodBinding,*receiver,gcFrame.result);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      return gcFrame.method;
    }
  }
  else {
    _Var1 = sysbvm_environment_lookSymbolRecursively
                      (context,*(sysbvm_tuple_t *)gcFrame.argument,(sysbvm_tuple_t)gcFrame.node,
                       &gcFrame.receiverType);
    if ((!_Var1) || (_Var1 = sysbvm_symbolBinding_isValue(context,gcFrame.receiverType), !_Var1)) {
      sysbvm_error("Failed to find symbol for message send without receiver.");
    }
    gcFrame.methodBinding = sysbvm_symbolValueBinding_getValue(gcFrame.receiverType);
  }
  memset(&callFrameStackRecord.roots,0,0xb0);
  memset(&i_1,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i_1);
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,
             gcFrame.methodBinding,slotCount + (long)(int)(uint)hasReceiver,0);
  if (hasReceiver) {
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,*receiver);
  }
  for (local_1a8 = 0; local_1a8 < slotCount; local_1a8 = local_1a8 + 1) {
    gcFrame.arguments = sysbvm_array_at(gcFrameRecord.roots[6],local_1a8);
    gcFrame.argumentNode =
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,gcFrame.arguments,*(sysbvm_tuple_t *)gcFrame.argument);
    sysbvm_functionCallFrameStack_push
              ((sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots,gcFrame.argumentNode);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i_1);
  gcFrame.method =
       sysbvm_functionCallFrameStack_finish
                 (context,(sysbvm_functionCallFrameStack_t *)&callFrameStackRecord.roots);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.method;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainMessageNode_analyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t chainedMessage, bool hasReceiver, sysbvm_tuple_t *receiver, sysbvm_tuple_t *environment)
{
    struct {
        sysbvm_astMessageChainMessageNode_t *node;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t methodBinding;
        sysbvm_tuple_t method;
        sysbvm_tuple_t result;

        sysbvm_tuple_t message;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
    } gcFrame = {
        .node = (sysbvm_astMessageChainMessageNode_t*)chainedMessage
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.node->super.sourcePosition);

    gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.node->selector, *environment);
    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.node->arguments);

    if(hasReceiver)
    {
        gcFrame.receiverType = sysbvm_tuple_getType(context, *receiver);
        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
        {
            gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                sysbvm_error("Message not understood.");

            gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);
            for(size_t i = 0; i < applicationArgumentCount; ++i)
            {
                gcFrame.argumentNode = sysbvm_array_at(gcFrame.node->arguments, i);
                gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
                sysbvm_array_atPut(gcFrame.argument, i, gcFrame.argument);
            }

            gcFrame.message = sysbvm_message_create(context, gcFrame.selector, gcFrame.arguments, gcFrame.receiverType, gcFrame.node->super.sourcePosition);
            gcFrame.result = sysbvm_function_apply2(context, gcFrame.method, *receiver, gcFrame.message);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.result;
        }
    }
    else
    {
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, gcFrame.selector, &gcFrame.methodBinding)
            || !sysbvm_symbolBinding_isValue(context, gcFrame.methodBinding))
            sysbvm_error("Failed to find symbol for message send without receiver.");
        gcFrame.method = sysbvm_symbolValueBinding_getValue(gcFrame.methodBinding);
    }


    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

    if(hasReceiver)
        sysbvm_functionCallFrameStack_push(&callFrameStack, *receiver);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.node->arguments, i);
        gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}